

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::DefaultCreateFunction
          (JavascriptLibrary *this,ParseableFunctionInfo *functionInfo,int length,
          DynamicObject *prototype,PropertyId nameId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptFunction *pSVar4;
  
  if (0xf < (uint)nameId) {
    bVar2 = ScriptContext::IsTrackedPropertyId
                      ((this->super_JavascriptLibraryBase).scriptContext.ptr,nameId);
    if (bVar2) goto LAB_00aa342c;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                              ,0x1340,
                              "(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId))"
                              ,
                              "nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId)"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00aa342c:
  pSVar4 = CreateScriptFunction
                     ((((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                      super_ScriptContextBase).javascriptLibrary,&functionInfo->super_FunctionProxy)
  ;
  (*(pSVar4->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(pSVar4,0xd1,(ulong)(uint)length | 0x1000000000000,2,0,0,0xf)
  ;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,nameId,pSVar4,6,0,0,0);
  return;
}

Assistant:

void JavascriptLibrary::DefaultCreateFunction(ParseableFunctionInfo * functionInfo, int length, DynamicObject * prototype, PropertyId nameId)
    {
        Assert(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId));
        ScriptFunction* function = scriptContext->GetLibrary()->CreateScriptFunction(functionInfo);
        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(length), PropertyConfigurable, nullptr);
        AddMember(prototype, nameId, function);
    }